

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSchemas.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  int iVar2;
  void *__addr;
  undefined8 uVar3;
  undefined8 *puVar4;
  long lVar5;
  int ret;
  xmlSchemaValidCtxtPtr ctxt_1;
  xmlDocPtr doc;
  char *base;
  stat info;
  int fd;
  xmlSchemaParserCtxtPtr ctxt;
  xmlSchemaPtr schema;
  int files;
  int i;
  char **argv_local;
  int argc_local;
  
  schema._0_4_ = 0;
  ctxt = (xmlSchemaParserCtxtPtr)0x0;
  for (schema._4_4_ = 1; schema._4_4_ < argc; schema._4_4_ = schema._4_4_ + 1) {
    iVar2 = strcmp(argv[schema._4_4_],"-debug");
    if ((iVar2 == 0) || (iVar2 = strcmp(argv[schema._4_4_],"--debug"), iVar2 == 0)) {
      debug = debug + 1;
    }
    else {
      iVar2 = strcmp(argv[schema._4_4_],"-memory");
      if ((iVar2 == 0) || (iVar2 = strcmp(argv[schema._4_4_],"--memory"), iVar2 == 0)) {
        memory = memory + 1;
      }
      else {
        iVar2 = strcmp(argv[schema._4_4_],"-noout");
        if ((iVar2 == 0) || (iVar2 = strcmp(argv[schema._4_4_],"--noout"), iVar2 == 0)) {
          noout = noout + 1;
        }
      }
    }
  }
  xmlLineNumbersDefault(1);
  for (schema._4_4_ = 1; schema._4_4_ < argc; schema._4_4_ = schema._4_4_ + 1) {
    if (*argv[schema._4_4_] != '-') {
      if (ctxt == (xmlSchemaParserCtxtPtr)0x0) {
        if (memory == 0) {
          uVar3 = xmlSchemaNewParserCtxt(argv[schema._4_4_]);
          puVar4 = (undefined8 *)__xmlGenericError();
          uVar1 = *puVar4;
          puVar4 = (undefined8 *)__xmlGenericError();
          xmlSchemaSetParserErrors(uVar3,uVar1,*puVar4,0);
          ctxt = (xmlSchemaParserCtxtPtr)xmlSchemaParse(uVar3);
          xmlSchemaFreeParserCtxt(uVar3);
        }
        else {
          iVar2 = stat64(argv[schema._4_4_],(stat64 *)&base);
          if (((iVar2 < 0) ||
              (info.__glibc_reserved[2]._4_4_ = open64(argv[schema._4_4_],0),
              info.__glibc_reserved[2]._4_4_ < 0)) ||
             (__addr = mmap64((void *)0x0,info.st_rdev,1,1,info.__glibc_reserved[2]._4_4_,0),
             __addr == (void *)0xffffffffffffffff)) break;
          uVar3 = xmlSchemaNewMemParserCtxt(__addr,info.st_rdev & 0xffffffff);
          puVar4 = (undefined8 *)__xmlGenericError();
          uVar1 = *puVar4;
          puVar4 = (undefined8 *)__xmlGenericError();
          xmlSchemaSetParserErrors(uVar3,uVar1,*puVar4,0);
          ctxt = (xmlSchemaParserCtxtPtr)xmlSchemaParse(uVar3);
          xmlSchemaFreeParserCtxt(uVar3);
          munmap(__addr,info.st_rdev);
        }
        if (debug != 0) {
          xmlSchemaDump(_stdout,ctxt);
        }
        if (ctxt == (xmlSchemaParserCtxtPtr)0x0) goto LAB_0010177f;
      }
      else {
        lVar5 = xmlReadFile(argv[schema._4_4_],0,0);
        if (lVar5 == 0) {
          fprintf(_stderr,"Could not parse %s\n",argv[schema._4_4_]);
        }
        else {
          uVar3 = xmlSchemaNewValidCtxt(ctxt);
          puVar4 = (undefined8 *)__xmlGenericError();
          uVar1 = *puVar4;
          puVar4 = (undefined8 *)__xmlGenericError();
          xmlSchemaSetValidErrors(uVar3,uVar1,*puVar4,0);
          iVar2 = xmlSchemaValidateDoc(uVar3,lVar5);
          if (iVar2 == 0) {
            printf("%s validates\n",argv[schema._4_4_]);
          }
          else if (iVar2 < 1) {
            printf("%s validation generated an internal error\n",argv[schema._4_4_]);
          }
          else {
            printf("%s fails to validate\n",argv[schema._4_4_]);
          }
          xmlSchemaFreeValidCtxt(uVar3);
          xmlFreeDoc(lVar5);
        }
      }
      schema._0_4_ = (int)schema + 1;
    }
  }
  if (ctxt != (xmlSchemaParserCtxtPtr)0x0) {
    xmlSchemaFree(ctxt);
  }
  if ((int)schema == 0) {
    printf("Usage : %s [--debug] [--noout] schemas XMLfiles ...\n",*argv);
    printf("\tParse the HTML files and output the result of the parsing\n");
    printf("\t--debug : dump a debug tree of the in-memory document\n");
    printf("\t--noout : do not print the result\n");
    printf("\t--memory : test the schemas in memory parsing\n");
  }
LAB_0010177f:
  xmlSchemaCleanupTypes();
  xmlCleanupParser();
  xmlMemoryDump();
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    int i;
    int files = 0;
    xmlSchemaPtr schema = NULL;

    for (i = 1; i < argc ; i++) {
#ifdef LIBXML_DEBUG_ENABLED
	if ((!strcmp(argv[i], "-debug")) || (!strcmp(argv[i], "--debug")))
	    debug++;
	else
#endif
#ifdef HAVE_MMAP
	if ((!strcmp(argv[i], "-memory")) || (!strcmp(argv[i], "--memory"))) {
	    memory++;
        } else
#endif
	if ((!strcmp(argv[i], "-noout")) || (!strcmp(argv[i], "--noout"))) {
	    noout++;
        }
    }
    xmlLineNumbersDefault(1);
    for (i = 1; i < argc ; i++) {
	if (argv[i][0] != '-') {
	    if (schema == NULL) {
		xmlSchemaParserCtxtPtr ctxt;

#ifdef HAVE_MMAP
		if (memory) {
		    int fd;
		    struct stat info;
		    const char *base;
		    if (stat(argv[i], &info) < 0)
			break;
		    if ((fd = open(argv[i], O_RDONLY)) < 0)
			break;
		    base = mmap(NULL, info.st_size, PROT_READ,
			        MAP_SHARED, fd, 0) ;
		    if (base == (void *) MAP_FAILED)
			break;

		    ctxt = xmlSchemaNewMemParserCtxt((char *)base,info.st_size);

		    xmlSchemaSetParserErrors(ctxt,
                            xmlGenericError, xmlGenericError, NULL);
		    schema = xmlSchemaParse(ctxt);
		    xmlSchemaFreeParserCtxt(ctxt);
		    munmap((char *) base, info.st_size);
		} else
#endif
		{
		    ctxt = xmlSchemaNewParserCtxt(argv[i]);
		    xmlSchemaSetParserErrors(ctxt,
                            xmlGenericError, xmlGenericError, NULL);
		    schema = xmlSchemaParse(ctxt);
		    xmlSchemaFreeParserCtxt(ctxt);
		}
#ifdef LIBXML_OUTPUT_ENABLED
#ifdef LIBXML_DEBUG_ENABLED
		if (debug)
		    xmlSchemaDump(stdout, schema);
#endif
#endif /* LIBXML_OUTPUT_ENABLED */
		if (schema == NULL)
		    goto failed_schemas;
	    } else {
		xmlDocPtr doc;

		doc = xmlReadFile(argv[i],NULL,0);

		if (doc == NULL) {
		    fprintf(stderr, "Could not parse %s\n", argv[i]);
		} else {
		    xmlSchemaValidCtxtPtr ctxt;
		    int ret;

		    ctxt = xmlSchemaNewValidCtxt(schema);
		    xmlSchemaSetValidErrors(ctxt,
                            xmlGenericError, xmlGenericError, NULL);
		    ret = xmlSchemaValidateDoc(ctxt, doc);
		    if (ret == 0) {
			printf("%s validates\n", argv[i]);
		    } else if (ret > 0) {
			printf("%s fails to validate\n", argv[i]);
		    } else {
			printf("%s validation generated an internal error\n",
			       argv[i]);
		    }
		    xmlSchemaFreeValidCtxt(ctxt);
		    xmlFreeDoc(doc);
		}
	    }
	    files ++;
	}
    }
    if (schema != NULL)
	xmlSchemaFree(schema);
    if (files == 0) {
	printf("Usage : %s [--debug] [--noout] schemas XMLfiles ...\n",
	       argv[0]);
	printf("\tParse the HTML files and output the result of the parsing\n");
#ifdef LIBXML_DEBUG_ENABLED
	printf("\t--debug : dump a debug tree of the in-memory document\n");
#endif
	printf("\t--noout : do not print the result\n");
#ifdef HAVE_MMAP
	printf("\t--memory : test the schemas in memory parsing\n");
#endif
    }
failed_schemas:
    xmlSchemaCleanupTypes();
    xmlCleanupParser();
    xmlMemoryDump();

    return(0);
}